

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O2

void YM2612_DacAndTimers_Update(ym2612_ *YM2612,DEV_SMPL **buffer,UINT32 length)

{
  channel_ *CH;
  DEV_SMPL *pDVar1;
  DEV_SMPL *pDVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  
  if (((YM2612->DAC != '\0') && (YM2612->DACdata != 0)) && (YM2612->DAC_Mute == '\0')) {
    pDVar1 = *buffer;
    pDVar2 = buffer[1];
    for (uVar6 = 0; length != uVar6; uVar6 = uVar6 + 1) {
      uVar7 = YM2612->DACdata;
      if (YM2612->DAC_Highpass_Enable != '\0') {
        iVar5 = uVar7 * 0x8000 - YM2612->dac_highpass;
        YM2612->dac_highpass = (iVar5 >> 9) + YM2612->dac_highpass;
        uVar7 = iVar5 >> 0xf;
      }
      pDVar1[uVar6] = pDVar1[uVar6] + (YM2612->CHANNEL[5].LEFT & uVar7);
      pDVar2[uVar6] = pDVar2[uVar6] + (uVar7 & YM2612->CHANNEL[5].RIGHT);
    }
  }
  iVar5 = length * YM2612->TimerBase;
  bVar3 = YM2612->Mode;
  if ((bVar3 & 1) != 0) {
    iVar4 = YM2612->TimerAcnt - iVar5;
    YM2612->TimerAcnt = iVar4;
    if (iVar4 < 1) {
      YM2612->Status = YM2612->Status | bVar3 >> 2 & 1;
      YM2612->TimerAcnt = iVar4 + YM2612->TimerAL;
      if ((char)bVar3 < '\0') {
        CH = YM2612->CHANNEL + 2;
        KEY_ON(CH,0);
        KEY_ON(CH,1);
        KEY_ON(CH,2);
        KEY_ON(CH,3);
        bVar3 = YM2612->Mode;
      }
    }
  }
  if ((bVar3 & 2) != 0) {
    iVar5 = YM2612->TimerBcnt - iVar5;
    YM2612->TimerBcnt = iVar5;
    if (iVar5 < 1) {
      YM2612->Status = YM2612->Status | (uint)(bVar3 >> 2 & 2);
      YM2612->TimerBcnt = iVar5 + YM2612->TimerBL;
    }
  }
  return;
}

Assistant:

void YM2612_DacAndTimers_Update(ym2612_ *YM2612, DEV_SMPL **buffer, UINT32 length)
{
  DEV_SMPL *bufL, *bufR;
  UINT32 i;

  if (YM2612->DAC && YM2612->DACdata && ! YM2612->DAC_Mute)
  {
    bufL = buffer[0];
    bufR = buffer[1];

    for (i = 0; i < length; i++)
    {
      int dac = YM2612->DACdata;
      if (YM2612->DAC_Highpass_Enable)
      {
        dac = (dac << highpass_fract) - YM2612->dac_highpass;
        YM2612->dac_highpass += dac >> highpass_shift;
        dac >>= highpass_fract;
      }
      bufL[i] += (dac & YM2612->CHANNEL[5].LEFT);
      bufR[i] += (dac & YM2612->CHANNEL[5].RIGHT);
    }
  }

  i = YM2612->TimerBase * length;

  if (YM2612->Mode & 1)             // Timer A ON ?
  {
//    if ((YM2612->TimerAcnt -= 14073) <= 0)   // 13879=NTSC (old: 14475=NTSC  14586=PAL)
    if ((YM2612->TimerAcnt -= i) <= 0)
    {
      YM2612->Status |= (YM2612->Mode & 0x04) >> 2;
      YM2612->TimerAcnt += YM2612->TimerAL;

#if YM_DEBUG_LEVEL > 0
      fprintf(debug_file, "Counter A overflow\n");
#endif

      if (YM2612->Mode & 0x80)
        CSM_Key_Control(YM2612);
    }
  }

  if (YM2612->Mode & 2)             // Timer B ON ?
  {
//    if ((YM2612->TimerBcnt -= 14073) <= 0)   // 13879=NTSC (old: 14475=NTSC  14586=PAL)
    if ((YM2612->TimerBcnt -= i) <= 0)
    {
      YM2612->Status |= (YM2612->Mode & 0x08) >> 2;
      YM2612->TimerBcnt += YM2612->TimerBL;

#if YM_DEBUG_LEVEL > 0
      fprintf(debug_file, "Counter B overflow\n");
#endif
    }
  }
}